

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

float Abc_NtkMfsTotalGlitchingLut(Abc_Ntk_t *pNtk,int nPats,int Prob,int fVerbose)

{
  Hop_Man_t *p_00;
  Hop_Obj_t *pRoot;
  int iVar1;
  int iVar2;
  int iVar3;
  int nRegs;
  int iVar4;
  int iVar5;
  uint i_00;
  Vec_Ptr_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *vTruth_00;
  Vec_Wrd_t *p_03;
  Gli_Man_t *p_04;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  uint *puVar8;
  word *pGateTruth;
  int local_80;
  int local_7c;
  int k;
  int i;
  uint *puTruth;
  word *pTruth;
  Vec_Wrd_t *vTruths;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Vec_Int_t *vTruth;
  Vec_Int_t *vFanins;
  Vec_Ptr_t *vNodes;
  Gli_Man_t *p;
  int local_28;
  int nGlitches;
  int nSwitches;
  int fVerbose_local;
  int Prob_local;
  int nPats_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcPrint.c"
                  ,0x6ee,"float Abc_NtkMfsTotalGlitchingLut(Abc_Ntk_t *, int, int, int)");
  }
  iVar1 = Abc_NtkGetFaninMax(pNtk);
  if (iVar1 < 7) {
    iVar1 = Abc_NtkGetFaninMax(pNtk);
    if (iVar1 < 7) {
      Abc_NtkToAig(pNtk);
      p_01 = Abc_NtkDfs(pNtk,0);
      p_02 = Vec_IntAlloc(6);
      vTruth_00 = Vec_IntAlloc(0x1000);
      iVar1 = Abc_NtkObjNumMax(pNtk);
      p_03 = Vec_WrdStart(iVar1);
      iVar1 = Vec_PtrSize(p_01);
      iVar2 = Abc_NtkCiNum(pNtk);
      iVar3 = Abc_NtkCoNum(pNtk);
      nRegs = Abc_NtkLatchNum(pNtk);
      iVar4 = Abc_NtkGetTotalFanins(pNtk);
      iVar5 = Abc_NtkCoNum(pNtk);
      p_04 = Gli_ManAlloc(iVar1 + iVar2 + iVar3,nRegs,iVar4 + iVar5);
      for (local_7c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_7c < iVar1; local_7c = local_7c + 1
          ) {
        pAVar6 = Abc_NtkObj(pNtk,local_7c);
        if (pAVar6 != (Abc_Obj_t *)0x0) {
          (pAVar6->field_6).iTemp = -1;
        }
      }
      for (local_7c = 0; iVar1 = Abc_NtkCiNum(pNtk), local_7c < iVar1; local_7c = local_7c + 1) {
        pAVar6 = Abc_NtkCi(pNtk,local_7c);
        iVar1 = Abc_ObjFanoutNum(pAVar6);
        iVar1 = Gli_ManCreateCi(p_04,iVar1);
        (pAVar6->field_6).iTemp = iVar1;
      }
      for (local_7c = 0; iVar1 = Vec_PtrSize(p_01), local_7c < iVar1; local_7c = local_7c + 1) {
        pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(p_01,local_7c);
        Vec_IntClear(p_02);
        for (local_80 = 0; iVar1 = Abc_ObjFaninNum(pAVar6), local_80 < iVar1;
            local_80 = local_80 + 1) {
          pAVar7 = Abc_ObjFanin(pAVar6,local_80);
          Vec_IntPush(p_02,(pAVar7->field_6).iTemp);
        }
        p_00 = (Hop_Man_t *)pNtk->pManFunc;
        pRoot = (Hop_Obj_t *)(pAVar6->field_5).pData;
        iVar1 = Abc_ObjFaninNum(pAVar6);
        puVar8 = Hop_ManConvertAigToTruth(p_00,pRoot,iVar1,vTruth_00,0);
        i_00 = Abc_ObjId(pAVar6);
        pGateTruth = Vec_WrdEntryP(p_03,i_00);
        iVar1 = Abc_ObjFaninNum(pAVar6);
        *pGateTruth = CONCAT44(puVar8[(int)(uint)(iVar1 == 6)],*puVar8);
        iVar1 = Abc_ObjFanoutNum(pAVar6);
        iVar1 = Gli_ManCreateNode(p_04,p_02,iVar1,pGateTruth);
        (pAVar6->field_6).iTemp = iVar1;
      }
      for (local_7c = 0; iVar1 = Abc_NtkCoNum(pNtk), local_7c < iVar1; local_7c = local_7c + 1) {
        pAVar6 = Abc_NtkCo(pNtk,local_7c);
        pAVar6 = Abc_ObjFanin0(pAVar6);
        Gli_ManCreateCo(p_04,(pAVar6->field_6).iTemp);
      }
      Gli_ManSwitchesAndGlitches(p_04,4000,0.125,0);
      p._4_4_ = 0;
      local_28 = 0;
      for (local_7c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_7c < iVar1; local_7c = local_7c + 1
          ) {
        pAVar6 = Abc_NtkObj(pNtk,local_7c);
        if ((pAVar6 != (Abc_Obj_t *)0x0) && (-1 < (pAVar6->field_6).iTemp)) {
          iVar1 = Abc_ObjFanoutNum(pAVar6);
          iVar2 = Gli_ObjNumSwitches(p_04,(pAVar6->field_6).iTemp);
          local_28 = iVar1 * iVar2 + local_28;
          iVar1 = Abc_ObjFanoutNum(pAVar6);
          iVar2 = Gli_ObjNumGlitches(p_04,(pAVar6->field_6).iTemp);
          p._4_4_ = iVar1 * iVar2 + p._4_4_;
        }
      }
      Gli_ManStop(p_04);
      Vec_PtrFree(p_01);
      Vec_IntFree(vTruth_00);
      Vec_IntFree(p_02);
      Vec_WrdFree(p_03);
      if (local_28 == 0) {
        pNtk_local._4_4_ = 0.0;
      }
      else {
        pNtk_local._4_4_ = ((float)(p._4_4_ - local_28) * 100.0) / (float)local_28;
      }
    }
    else {
      printf(
            "Abc_NtkMfsTotalGlitching() This procedure works only for mapped networks with LUTs size up to 6 inputs.\n"
            );
      pNtk_local._4_4_ = -1.0;
    }
    return pNtk_local._4_4_;
  }
  __assert_fail("Abc_NtkGetFaninMax(pNtk) <= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcPrint.c"
                ,0x6ef,"float Abc_NtkMfsTotalGlitchingLut(Abc_Ntk_t *, int, int, int)");
}

Assistant:

float Abc_NtkMfsTotalGlitchingLut( Abc_Ntk_t * pNtk, int nPats, int Prob, int fVerbose )
{
    int nSwitches, nGlitches;
    Gli_Man_t * p;
    Vec_Ptr_t * vNodes;
    Vec_Int_t * vFanins, * vTruth;
    Abc_Obj_t * pObj, * pFanin;
    Vec_Wrd_t * vTruths; word * pTruth;
    unsigned * puTruth;
    int i, k;
    assert( Abc_NtkIsLogic(pNtk) );
    assert( Abc_NtkGetFaninMax(pNtk) <= 6 );
    if ( Abc_NtkGetFaninMax(pNtk) > 6 )
    {
        printf( "Abc_NtkMfsTotalGlitching() This procedure works only for mapped networks with LUTs size up to 6 inputs.\n" );
        return -1.0;
    }
    Abc_NtkToAig( pNtk );
    vNodes = Abc_NtkDfs( pNtk, 0 );
    vFanins = Vec_IntAlloc( 6 );
    vTruth = Vec_IntAlloc( 1 << 12 );
    vTruths = Vec_WrdStart( Abc_NtkObjNumMax(pNtk) );

    // derive network for glitch computation
    p = Gli_ManAlloc( Vec_PtrSize(vNodes) + Abc_NtkCiNum(pNtk) + Abc_NtkCoNum(pNtk),
        Abc_NtkLatchNum(pNtk), Abc_NtkGetTotalFanins(pNtk) + Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachObj( pNtk, pObj, i )
        pObj->iTemp = -1;
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->iTemp = Gli_ManCreateCi( p, Abc_ObjFanoutNum(pObj) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Vec_IntClear( vFanins );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vFanins, pFanin->iTemp );
        puTruth = Hop_ManConvertAigToTruth( (Hop_Man_t *)pNtk->pManFunc, (Hop_Obj_t *)pObj->pData, Abc_ObjFaninNum(pObj), vTruth, 0 );
        pTruth = Vec_WrdEntryP( vTruths, Abc_ObjId(pObj) );
        *pTruth = ((word)puTruth[Abc_ObjFaninNum(pObj) == 6] << 32) | (word)puTruth[0];
        pObj->iTemp = Gli_ManCreateNode( p, vFanins, Abc_ObjFanoutNum(pObj), pTruth );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
        Gli_ManCreateCo( p, Abc_ObjFanin0(pObj)->iTemp );

    // compute glitching
    Gli_ManSwitchesAndGlitches( p, 4000, 1.0/8.0, 0 );

    // compute the ratio
    nSwitches = nGlitches = 0;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->iTemp >= 0 )
        {
            nSwitches += Abc_ObjFanoutNum(pObj) * Gli_ObjNumSwitches(p, pObj->iTemp);
            nGlitches += Abc_ObjFanoutNum(pObj) * Gli_ObjNumGlitches(p, pObj->iTemp);
        }

    Gli_ManStop( p );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vTruth );
    Vec_IntFree( vFanins );
    Vec_WrdFree( vTruths );
    return nSwitches ? 100.0*(nGlitches-nSwitches)/nSwitches : 0.0;
}